

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O0

int dotwoweapon(void)

{
  obj *obj;
  schar sVar1;
  int iVar2;
  obj *tmp;
  
  if (u.twoweap == '\0') {
    iVar2 = can_twoweapon();
    if (iVar2 == 0) {
      tmp._4_4_ = 0;
    }
    else {
      pline("You begin two-weapon combat.");
      u.twoweap = '\x01';
      setuswapwep(uswapwep);
      update_inventory();
      iVar2 = rnd(0x14);
      sVar1 = acurr(3);
      tmp._4_4_ = (uint)(sVar1 < iVar2);
    }
  }
  else {
    pline("You switch to your primary weapon.");
    obj = uswapwep;
    u.twoweap = '\0';
    setuswapwep((obj *)0x0);
    setuswapwep(obj);
    update_inventory();
    tmp._4_4_ = 0;
  }
  return tmp._4_4_;
}

Assistant:

int dotwoweapon(void)
{
	/* You can always toggle it off */
	if (u.twoweap) {
		struct obj *tmp;
		pline("You switch to your primary weapon.");
		tmp = uswapwep;
		u.twoweap = 0;
		setuswapwep(NULL);
		setuswapwep(tmp);
		update_inventory();
		return 0;
	}

	/* May we use two weapons? */
	if (can_twoweapon()) {
		/* Success! */
		pline("You begin two-weapon combat.");
		u.twoweap = 1;
		setuswapwep(uswapwep);
		update_inventory();
		return rnd(20) > ACURR(A_DEX);
	}
	return 0;
}